

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void uc_add_inline_hook_s390x(uc_struct *uc,hook *hk,void **args,int args_len)

{
  TCGContext_conflict12 *tcg_ctx_00;
  GHashTable *hash_table;
  undefined8 *value;
  char *__s;
  GHashTable *helper_table;
  TCGContext_conflict12 *tcg_ctx;
  uint sizemask;
  char *name;
  TCGHelperInfo *info;
  int args_len_local;
  void **args_local;
  hook *hk_local;
  uc_struct *uc_local;
  
  value = (undefined8 *)g_malloc(0x18);
  __s = (char *)g_malloc(0x40);
  tcg_ctx._4_4_ = 0xffffffff;
  tcg_ctx_00 = (TCGContext_conflict12 *)uc->tcg_ctx;
  hash_table = (GHashTable *)uc->tcg_ctx[1].free_temps[2].l[1];
  *value = hk->callback;
  value[1] = __s;
  *(undefined4 *)(value + 2) = 0;
  if ((hk->type == 4) || (hk->type == 8)) {
    tcg_ctx._4_4_ = 0x114;
    snprintf(__s,0x3f,"hookcode_%d_%lx",(ulong)(uint)hk->type,hk->callback);
  }
  __s[0x3f] = '\0';
  value[1] = __s;
  *(undefined4 *)((long)value + 0x14) = tcg_ctx._4_4_;
  g_hash_table_insert(hash_table,(gpointer)*value,value);
  g_hash_table_insert((GHashTable *)uc->tcg_ctx[1].free_temps[2].l[2],(gpointer)*value,value);
  tcg_gen_callN_s390x(tcg_ctx_00,(void *)*value,(TCGTemp *)0x0,args_len,(TCGTemp **)args);
  return;
}

Assistant:

void uc_add_inline_hook(uc_engine *uc, struct hook *hk, void** args, int args_len)
{
    TCGHelperInfo* info = g_malloc(sizeof(TCGHelperInfo));
    char *name = g_malloc(64);
    unsigned sizemask = 0xFFFFFFFF;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    GHashTable *helper_table = uc->tcg_ctx->helper_table;

    info->func = hk->callback;
    info->name = name;
    info->flags = 0; // From helper-head.h

    // Only UC_HOOK_BLOCK and UC_HOOK_CODE is generated into tcg code and can be inlined.
    switch (hk->type) {
    case UC_HOOK_BLOCK:
    case UC_HOOK_CODE:
        // (*uc_cb_hookcode_t)(uc_engine *uc, uint64_t address, uint32_t size, void *user_data);
        sizemask = dh_sizemask(void, 0) | dh_sizemask(ptr, 1) | dh_sizemask(i64, 2) | dh_sizemask(i32, 3) | dh_sizemask(ptr, 4);
        snprintf(name, 63, "hookcode_%d_%" PRIx64 , hk->type, (uint64_t)hk->callback);
        break;

    default:
        break;
    }

    name[63] = 0;
    info->name = name;
    info->sizemask = sizemask;

    g_hash_table_insert(helper_table, (gpointer)info->func, (gpointer)info);
    g_hash_table_insert(uc->tcg_ctx->custom_helper_infos, (gpointer)info->func, (gpointer)info);

    tcg_gen_callN(tcg_ctx, info->func, NULL, args_len, (TCGTemp**)args);
}